

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  Geometry *pGVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar31;
  undefined1 auVar25 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar69;
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar75;
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar77 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar92;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_aa9;
  long local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  int local_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  undefined1 local_a68 [16];
  RayQueryContext *local_a50;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  undefined8 local_9e8;
  float fStack_9e0;
  float fStack_9dc;
  undefined1 *local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  uint local_9b0;
  uint local_9ac;
  uint local_9a8;
  RTCFilterFunctionNArguments local_998;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8e8 [16];
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar34 = ray->tfar, 0.0 <= fVar34)) {
    local_a50 = context;
    puVar19 = local_7d8 + 1;
    fVar82 = (ray->org).field_0.m128[0];
    fVar74 = (ray->org).field_0.m128[1];
    fVar23 = (ray->org).field_0.m128[2];
    fVar24 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar5 = (ray->dir).field_0.field_1;
    auVar66._4_4_ = -(uint)(ABS(aVar5.y) < 1e-18);
    auVar66._0_4_ = -(uint)(ABS(aVar5.x) < 1e-18);
    auVar66._8_4_ = -(uint)(ABS(aVar5.z) < 1e-18);
    auVar66._12_4_ = -(uint)(ABS(aVar5.field_3.w) < 1e-18);
    auVar65 = divps(_DAT_01f46a60,(undefined1  [16])aVar5);
    auVar66 = blendvps(auVar65,_DAT_01f76a70,auVar66);
    fVar75 = auVar66._0_4_ * 0.99999964;
    fVar78 = auVar66._4_4_ * 0.99999964;
    fVar80 = auVar66._8_4_ * 0.99999964;
    fVar63 = auVar66._0_4_ * 1.0000004;
    fVar69 = auVar66._4_4_ * 1.0000004;
    fVar71 = auVar66._8_4_ * 1.0000004;
    fVar51 = 0.0;
    if (0.0 <= fVar24) {
      fVar51 = fVar24;
    }
    uVar20 = (ulong)(fVar75 < 0.0) << 4;
    uVar17 = (ulong)(fVar78 < 0.0) << 4 | 0x20;
    uVar21 = (ulong)(fVar80 < 0.0) << 4 | 0x40;
    uVar22 = uVar20 ^ 0x10;
    auVar65._4_4_ = fVar51;
    auVar65._0_4_ = fVar51;
    auVar65._8_4_ = fVar51;
    auVar65._12_4_ = fVar51;
    local_9d0 = mm_lookupmask_ps;
    local_898 = mm_lookupmask_ps._240_16_;
    local_8c8 = fVar34;
    fStack_8c4 = fVar34;
    fStack_8c0 = fVar34;
    fStack_8bc = fVar34;
    local_8d8 = fVar23;
    fStack_8d4 = fVar23;
    fStack_8d0 = fVar23;
    fStack_8cc = fVar23;
    local_8e8 = auVar65;
    local_8f8 = fVar71;
    fStack_8f4 = fVar71;
    fStack_8f0 = fVar71;
    fStack_8ec = fVar71;
    local_908 = fVar80;
    fStack_904 = fVar80;
    fStack_900 = fVar80;
    fStack_8fc = fVar80;
    local_918 = fVar82;
    fStack_914 = fVar82;
    fStack_910 = fVar82;
    fStack_90c = fVar82;
    local_928 = fVar74;
    fStack_924 = fVar74;
    fStack_920 = fVar74;
    fStack_91c = fVar74;
    local_938 = fVar75;
    fStack_934 = fVar75;
    fStack_930 = fVar75;
    fStack_92c = fVar75;
    local_948 = fVar78;
    fStack_944 = fVar78;
    fStack_940 = fVar78;
    fStack_93c = fVar78;
    local_958 = fVar63;
    fStack_954 = fVar63;
    fStack_950 = fVar63;
    fStack_94c = fVar63;
    local_968 = fVar69;
    fStack_964 = fVar69;
    fStack_960 = fVar69;
    fStack_95c = fVar69;
    fVar51 = fVar34;
    fVar24 = fVar34;
    fVar31 = fVar34;
    fVar32 = fVar23;
    fVar33 = fVar23;
    fVar44 = fVar23;
    fVar49 = fVar75;
    fVar50 = fVar75;
    fVar52 = fVar75;
    fVar53 = fVar78;
    fVar54 = fVar78;
    fVar55 = fVar78;
    fVar56 = fVar69;
    fVar57 = fVar69;
    fVar58 = fVar69;
    fVar60 = fVar82;
    fVar61 = fVar82;
    fVar62 = fVar82;
    fVar64 = fVar71;
    fVar70 = fVar71;
    fVar72 = fVar71;
    fVar73 = fVar80;
    fVar76 = fVar80;
    fVar79 = fVar80;
    fVar81 = fVar74;
    fVar83 = fVar74;
    fVar85 = fVar74;
    fVar86 = fVar63;
    fVar87 = fVar63;
    fVar88 = fVar63;
LAB_00682837:
    if (puVar19 != local_7d8) {
      uVar15 = puVar19[-1];
      puVar19 = puVar19 + -1;
      while ((uVar15 & 8) == 0) {
        pfVar1 = (float *)(uVar15 + 0x20 + uVar20);
        auVar39._0_4_ = (*pfVar1 - fVar82) * fVar75;
        auVar39._4_4_ = (pfVar1[1] - fVar60) * fVar49;
        auVar39._8_4_ = (pfVar1[2] - fVar61) * fVar50;
        auVar39._12_4_ = (pfVar1[3] - fVar62) * fVar52;
        pfVar1 = (float *)(uVar15 + 0x20 + uVar17);
        auVar35._0_4_ = (*pfVar1 - fVar74) * fVar78;
        auVar35._4_4_ = (pfVar1[1] - fVar81) * fVar53;
        auVar35._8_4_ = (pfVar1[2] - fVar83) * fVar54;
        auVar35._12_4_ = (pfVar1[3] - fVar85) * fVar55;
        auVar66 = maxps(auVar39,auVar35);
        pfVar1 = (float *)(uVar15 + 0x20 + uVar21);
        auVar36._0_4_ = (*pfVar1 - fVar23) * fVar80;
        auVar36._4_4_ = (pfVar1[1] - fVar32) * fVar73;
        auVar36._8_4_ = (pfVar1[2] - fVar33) * fVar76;
        auVar36._12_4_ = (pfVar1[3] - fVar44) * fVar79;
        auVar37 = maxps(auVar36,auVar65);
        auVar66 = maxps(auVar66,auVar37);
        pfVar1 = (float *)(uVar15 + 0x20 + uVar22);
        auVar38._0_4_ = (*pfVar1 - fVar82) * fVar63;
        auVar38._4_4_ = (pfVar1[1] - fVar60) * fVar86;
        auVar38._8_4_ = (pfVar1[2] - fVar61) * fVar87;
        auVar38._12_4_ = (pfVar1[3] - fVar62) * fVar88;
        pfVar1 = (float *)(uVar15 + 0x20 + (uVar17 ^ 0x10));
        auVar41._0_4_ = (*pfVar1 - fVar74) * fVar69;
        auVar41._4_4_ = (pfVar1[1] - fVar81) * fVar56;
        auVar41._8_4_ = (pfVar1[2] - fVar83) * fVar57;
        auVar41._12_4_ = (pfVar1[3] - fVar85) * fVar58;
        auVar39 = minps(auVar38,auVar41);
        pfVar1 = (float *)(uVar15 + 0x20 + (uVar21 ^ 0x10));
        auVar42._0_4_ = (*pfVar1 - fVar23) * fVar71;
        auVar42._4_4_ = (pfVar1[1] - fVar32) * fVar64;
        auVar42._8_4_ = (pfVar1[2] - fVar33) * fVar70;
        auVar42._12_4_ = (pfVar1[3] - fVar44) * fVar72;
        auVar37._4_4_ = fVar51;
        auVar37._0_4_ = fVar34;
        auVar37._8_4_ = fVar24;
        auVar37._12_4_ = fVar31;
        auVar37 = minps(auVar42,auVar37);
        auVar37 = minps(auVar39,auVar37);
        auVar25._4_4_ = -(uint)(auVar66._4_4_ <= auVar37._4_4_);
        auVar25._0_4_ = -(uint)(auVar66._0_4_ <= auVar37._0_4_);
        auVar25._8_4_ = -(uint)(auVar66._8_4_ <= auVar37._8_4_);
        auVar25._12_4_ = -(uint)(auVar66._12_4_ <= auVar37._12_4_);
        uVar13 = movmskps((int)local_9d0,auVar25);
        local_9d0 = (undefined1 *)(ulong)uVar13;
        if (uVar13 == 0) goto LAB_00682837;
        local_9d0 = (undefined1 *)(uVar15 & 0xfffffffffffffff0);
        lVar7 = 0;
        if ((byte)uVar13 != 0) {
          for (; ((byte)uVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar15 = *(ulong *)(local_9d0 + lVar7 * 8);
        uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
        uVar16 = (ulong)uVar13;
        if (uVar13 != 0) {
          do {
            *puVar19 = uVar15;
            puVar19 = puVar19 + 1;
            lVar7 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar15 = *(ulong *)(local_9d0 + lVar7 * 8);
            uVar16 = uVar16 - 1 & uVar16;
          } while (uVar16 != 0);
        }
      }
      uVar16 = uVar15 & 0xfffffffffffffff0;
      puVar18 = (undefined1 *)((ulong)((uint)uVar15 & 0xf) - 8);
      for (local_9d0 = (undefined1 *)0x0; local_9d0 != puVar18; local_9d0 = local_9d0 + 1) {
        local_aa8 = (long)local_9d0 * 0xb0;
        fVar34 = (ray->org).field_0.m128[0];
        fVar51 = (ray->org).field_0.m128[1];
        fVar82 = (ray->org).field_0.m128[2];
        pfVar1 = (float *)(uVar16 + local_aa8);
        pfVar2 = (float *)(uVar16 + 0x10 + local_aa8);
        pfVar3 = (float *)(uVar16 + 0x20 + local_aa8);
        pfVar4 = (float *)(uVar16 + 0x30 + local_aa8);
        fVar97 = *pfVar1 - fVar34;
        fVar99 = pfVar1[1] - fVar34;
        fStack_a30 = pfVar1[2] - fVar34;
        fStack_a2c = pfVar1[3] - fVar34;
        fVar88 = *pfVar2 - fVar51;
        fVar89 = pfVar2[1] - fVar51;
        fStack_a40 = pfVar2[2] - fVar51;
        fStack_a3c = pfVar2[3] - fVar51;
        fVar93 = *pfVar3 - fVar82;
        fVar95 = pfVar3[1] - fVar82;
        fStack_9f0 = pfVar3[2] - fVar82;
        fStack_9ec = pfVar3[3] - fVar82;
        fVar23 = *pfVar4 - fVar34;
        fVar78 = pfVar4[1] - fVar34;
        fVar80 = pfVar4[2] - fVar34;
        fVar32 = pfVar4[3] - fVar34;
        pfVar1 = (float *)(uVar16 + 0x40 + local_aa8);
        fVar54 = *pfVar1 - fVar51;
        fVar55 = pfVar1[1] - fVar51;
        fVar56 = pfVar1[2] - fVar51;
        fVar57 = pfVar1[3] - fVar51;
        pfVar1 = (float *)(uVar16 + 0x50 + local_aa8);
        fVar24 = *pfVar1 - fVar82;
        fVar69 = pfVar1[1] - fVar82;
        fVar63 = pfVar1[2] - fVar82;
        fVar33 = pfVar1[3] - fVar82;
        pfVar1 = (float *)(uVar16 + 0x60 + local_aa8);
        fVar75 = *pfVar1 - fVar34;
        fVar71 = pfVar1[1] - fVar34;
        fVar31 = pfVar1[2] - fVar34;
        fVar34 = pfVar1[3] - fVar34;
        pfVar1 = (float *)(uVar16 + 0x70 + local_aa8);
        fVar44 = *pfVar1 - fVar51;
        fVar49 = pfVar1[1] - fVar51;
        fVar50 = pfVar1[2] - fVar51;
        fVar51 = pfVar1[3] - fVar51;
        pfVar1 = (float *)(uVar16 + 0x80 + local_aa8);
        fVar76 = *pfVar1 - fVar82;
        fVar79 = pfVar1[1] - fVar82;
        fVar81 = pfVar1[2] - fVar82;
        fVar82 = pfVar1[3] - fVar82;
        fVar64 = fVar75 - fVar97;
        fVar70 = fVar71 - fVar99;
        fVar72 = fVar31 - fStack_a30;
        fVar73 = fVar34 - fStack_a2c;
        local_a18 = fVar44 - fVar88;
        fStack_a14 = fVar49 - fVar89;
        fStack_a10 = fVar50 - fStack_a40;
        fStack_a0c = fVar51 - fStack_a3c;
        fVar90 = fVar76 - fVar93;
        fVar92 = fVar79 - fVar95;
        fStack_a00 = fVar81 - fStack_9f0;
        fStack_9fc = fVar82 - fStack_9ec;
        local_a78 = CONCAT44(fVar70,fVar64);
        fStack_a70 = fVar72;
        fStack_a6c = fVar73;
        local_a08 = (undefined1 *)CONCAT44(fVar92,fVar90);
        fVar74 = (ray->dir).field_0.m128[0];
        local_8a8 = (ray->dir).field_0.m128[1];
        fStack_aa0 = (ray->dir).field_0.m128[2];
        local_888 = (local_a18 * (fVar93 + fVar76) - (fVar88 + fVar44) * fVar90) * fVar74 +
                    ((fVar97 + fVar75) * fVar90 - (fVar93 + fVar76) * fVar64) * local_8a8 +
                    (fVar64 * (fVar88 + fVar44) - (fVar97 + fVar75) * local_a18) * fStack_aa0;
        fStack_884 = (fStack_a14 * (fVar95 + fVar79) - (fVar89 + fVar49) * fVar92) * fVar74 +
                     ((fVar99 + fVar71) * fVar92 - (fVar95 + fVar79) * fVar70) * local_8a8 +
                     (fVar70 * (fVar89 + fVar49) - (fVar99 + fVar71) * fStack_a14) * fStack_aa0;
        local_a68._0_8_ = CONCAT44(fStack_884,local_888);
        local_a68._8_4_ =
             (fStack_a10 * (fStack_9f0 + fVar81) - (fStack_a40 + fVar50) * fStack_a00) * fVar74 +
             ((fStack_a30 + fVar31) * fStack_a00 - (fStack_9f0 + fVar81) * fVar72) * local_8a8 +
             (fVar72 * (fStack_a40 + fVar50) - (fStack_a30 + fVar31) * fStack_a10) * fStack_aa0;
        local_a68._12_4_ =
             (fStack_a0c * (fStack_9ec + fVar82) - (fStack_a3c + fVar51) * fStack_9fc) * fVar74 +
             ((fStack_a2c + fVar34) * fStack_9fc - (fStack_9ec + fVar82) * fVar73) * local_8a8 +
             (fVar73 * (fStack_a3c + fVar51) - (fStack_a2c + fVar34) * fStack_a0c) * fStack_aa0;
        fVar52 = fVar97 - fVar23;
        fVar53 = fVar99 - fVar78;
        fStack_9e0 = fStack_a30 - fVar80;
        fStack_9dc = fStack_a2c - fVar32;
        fVar83 = fVar88 - fVar54;
        fVar85 = fVar89 - fVar55;
        fVar86 = fStack_a40 - fVar56;
        fVar87 = fStack_a3c - fVar57;
        fVar58 = fVar93 - fVar24;
        fVar60 = fVar95 - fVar69;
        fVar61 = fStack_9f0 - fVar63;
        fVar62 = fStack_9ec - fVar33;
        local_a48 = (Ray *)CONCAT44(fVar89,fVar88);
        local_9f8 = (ulong *)CONCAT44(fVar95,fVar93);
        local_9e8 = (Scene *)CONCAT44(fVar53,fVar52);
        local_a38 = (RTCIntersectArguments *)CONCAT44(fVar99,fVar97);
        local_a88 = (fVar83 * (fVar93 + fVar24) - (fVar88 + fVar54) * fVar58) * fVar74 +
                    ((fVar97 + fVar23) * fVar58 - (fVar93 + fVar24) * fVar52) * local_8a8 +
                    (fVar52 * (fVar88 + fVar54) - (fVar97 + fVar23) * fVar83) * fStack_aa0;
        fStack_a84 = (fVar85 * (fVar95 + fVar69) - (fVar89 + fVar55) * fVar60) * fVar74 +
                     ((fVar99 + fVar78) * fVar60 - (fVar95 + fVar69) * fVar53) * local_8a8 +
                     (fVar53 * (fVar89 + fVar55) - (fVar99 + fVar78) * fVar85) * fStack_aa0;
        fStack_a80 = (fVar86 * (fStack_9f0 + fVar63) - (fStack_a40 + fVar56) * fVar61) * fVar74 +
                     ((fStack_a30 + fVar80) * fVar61 - (fStack_9f0 + fVar63) * fStack_9e0) *
                     local_8a8 +
                     (fStack_9e0 * (fStack_a40 + fVar56) - (fStack_a30 + fVar80) * fVar86) *
                     fStack_aa0;
        fStack_a7c = (fVar87 * (fStack_9ec + fVar33) - (fStack_a3c + fVar57) * fVar62) * fVar74 +
                     ((fStack_a2c + fVar32) * fVar62 - (fStack_9ec + fVar33) * fStack_9dc) *
                     local_8a8 +
                     (fStack_9dc * (fStack_a3c + fVar57) - (fStack_a2c + fVar32) * fVar87) *
                     fStack_aa0;
        local_8b8 = fVar23 - fVar75;
        fStack_8b4 = fVar78 - fVar71;
        fStack_8b0 = fVar80 - fVar31;
        fStack_8ac = fVar32 - fVar34;
        fVar94 = fVar54 - fVar44;
        fVar96 = fVar55 - fVar49;
        fStack_a70 = fVar56 - fVar50;
        fStack_a6c = fVar57 - fVar51;
        fVar98 = fVar24 - fVar76;
        fVar100 = fVar69 - fVar79;
        fVar101 = fVar63 - fVar81;
        fVar102 = fVar33 - fVar82;
        auVar43._0_4_ =
             (fVar94 * (fVar76 + fVar24) - (fVar44 + fVar54) * fVar98) * fVar74 +
             ((fVar75 + fVar23) * fVar98 - (fVar76 + fVar24) * local_8b8) * local_8a8 +
             (local_8b8 * (fVar44 + fVar54) - (fVar75 + fVar23) * fVar94) * fStack_aa0;
        auVar43._4_4_ =
             (fVar96 * (fVar79 + fVar69) - (fVar49 + fVar55) * fVar100) * fVar74 +
             ((fVar71 + fVar78) * fVar100 - (fVar79 + fVar69) * fStack_8b4) * local_8a8 +
             (fStack_8b4 * (fVar49 + fVar55) - (fVar71 + fVar78) * fVar96) * fStack_aa0;
        auVar43._8_4_ =
             (fStack_a70 * (fVar81 + fVar63) - (fVar50 + fVar56) * fVar101) * fVar74 +
             ((fVar31 + fVar80) * fVar101 - (fVar81 + fVar63) * fStack_8b0) * local_8a8 +
             (fStack_8b0 * (fVar50 + fVar56) - (fVar31 + fVar80) * fStack_a70) * fStack_aa0;
        auVar43._12_4_ =
             (fStack_a6c * (fVar82 + fVar33) - (fVar51 + fVar57) * fVar102) * fVar74 +
             ((fVar34 + fVar32) * fVar102 - (fVar82 + fVar33) * fStack_8ac) * local_8a8 +
             (fStack_8ac * (fVar51 + fVar57) - (fVar34 + fVar32) * fStack_a6c) * fStack_aa0;
        local_a28 = local_a88 + local_888 + auVar43._0_4_;
        fStack_a24 = fStack_a84 + fStack_884 + auVar43._4_4_;
        fStack_a20 = fStack_a80 + local_a68._8_4_ + auVar43._8_4_;
        fStack_a1c = fStack_a7c + local_a68._12_4_ + auVar43._12_4_;
        auVar26._8_4_ = local_a68._8_4_;
        auVar26._0_8_ = local_a68._0_8_;
        auVar26._12_4_ = local_a68._12_4_;
        auVar8._4_4_ = fStack_a84;
        auVar8._0_4_ = local_a88;
        auVar8._8_4_ = fStack_a80;
        auVar8._12_4_ = fStack_a7c;
        auVar66 = minps(auVar26,auVar8);
        auVar66 = minps(auVar66,auVar43);
        auVar45._8_4_ = local_a68._8_4_;
        auVar45._0_8_ = local_a68._0_8_;
        auVar45._12_4_ = local_a68._12_4_;
        auVar9._4_4_ = fStack_a84;
        auVar9._0_4_ = local_a88;
        auVar9._8_4_ = fStack_a80;
        auVar9._12_4_ = fStack_a7c;
        auVar65 = maxps(auVar45,auVar9);
        auVar65 = maxps(auVar65,auVar43);
        fVar34 = ABS(local_a28) * 1.1920929e-07;
        fVar51 = ABS(fStack_a24) * 1.1920929e-07;
        fVar82 = ABS(fStack_a20) * 1.1920929e-07;
        fVar23 = ABS(fStack_a1c) * 1.1920929e-07;
        auVar46._4_4_ = -(uint)(auVar65._4_4_ <= fVar51);
        auVar46._0_4_ = -(uint)(auVar65._0_4_ <= fVar34);
        auVar46._8_4_ = -(uint)(auVar65._8_4_ <= fVar82);
        auVar46._12_4_ = -(uint)(auVar65._12_4_ <= fVar23);
        auVar27._4_4_ = -(uint)(-fVar51 <= auVar66._4_4_);
        auVar27._0_4_ = -(uint)(-fVar34 <= auVar66._0_4_);
        auVar27._8_4_ = -(uint)(-fVar82 <= auVar66._8_4_);
        auVar27._12_4_ = -(uint)(-fVar23 <= auVar66._12_4_);
        auVar46 = auVar46 | auVar27;
        auVar47._0_4_ = auVar46._0_4_ & local_898._0_4_;
        auVar47._4_4_ = auVar46._4_4_ & local_898._4_4_;
        auVar47._8_4_ = auVar46._8_4_ & local_898._8_4_;
        auVar47._12_4_ = auVar46._12_4_ & local_898._12_4_;
        iVar14 = movmskps((int)local_9d0,auVar47);
        local_a48 = ray;
        local_a08 = puVar18;
        local_9f8 = puVar19;
        local_a78 = uVar20;
        if (iVar14 != 0) {
          fStack_8a4 = local_8a8;
          fStack_8a0 = local_8a8;
          fStack_89c = local_8a8;
          auVar59._0_4_ = fVar83 * fVar98 - fVar58 * fVar94;
          auVar59._4_4_ = fVar85 * fVar100 - fVar60 * fVar96;
          auVar59._8_4_ = fVar86 * fVar101 - fVar61 * fStack_a70;
          auVar59._12_4_ = fVar87 * fVar102 - fVar62 * fStack_a6c;
          local_a78 = CONCAT44(fVar96,fVar94);
          auVar28._4_4_ = -(uint)(ABS(fVar85 * fVar92) < ABS(fVar60 * fVar96));
          auVar28._0_4_ = -(uint)(ABS(fVar83 * fVar90) < ABS(fVar58 * fVar94));
          auVar28._8_4_ = -(uint)(ABS(fVar86 * fStack_a00) < ABS(fVar61 * fStack_a70));
          auVar28._12_4_ = -(uint)(ABS(fVar87 * fStack_9fc) < ABS(fVar62 * fStack_a6c));
          auVar11._4_4_ = fStack_a14 * fVar60 - fVar85 * fVar92;
          auVar11._0_4_ = local_a18 * fVar58 - fVar83 * fVar90;
          auVar11._8_4_ = fStack_a10 * fVar61 - fVar86 * fStack_a00;
          auVar11._12_4_ = fStack_a0c * fVar62 - fVar87 * fStack_9fc;
          local_808 = blendvps(auVar59,auVar11,auVar28);
          auVar91._0_4_ = fVar58 * local_8b8 - fVar52 * fVar98;
          auVar91._4_4_ = fVar60 * fStack_8b4 - fVar53 * fVar100;
          auVar91._8_4_ = fVar61 * fStack_8b0 - fStack_9e0 * fVar101;
          auVar91._12_4_ = fVar62 * fStack_8ac - fStack_9dc * fVar102;
          auVar29._4_4_ = -(uint)(ABS(fVar60 * fVar70) < ABS(fVar53 * fVar100));
          auVar29._0_4_ = -(uint)(ABS(fVar58 * fVar64) < ABS(fVar52 * fVar98));
          auVar29._8_4_ = -(uint)(ABS(fVar61 * fVar72) < ABS(fStack_9e0 * fVar101));
          auVar29._12_4_ = -(uint)(ABS(fVar62 * fVar73) < ABS(fStack_9dc * fVar102));
          auVar10._4_4_ = fVar92 * fVar53 - fVar60 * fVar70;
          auVar10._0_4_ = fVar90 * fVar52 - fVar58 * fVar64;
          auVar10._8_4_ = fStack_a00 * fStack_9e0 - fVar61 * fVar72;
          auVar10._12_4_ = fStack_9fc * fStack_9dc - fVar62 * fVar73;
          local_7f8 = blendvps(auVar91,auVar10,auVar29);
          auVar84._0_4_ = fVar52 * fVar94 - fVar83 * local_8b8;
          auVar84._4_4_ = fVar53 * fVar96 - fVar85 * fStack_8b4;
          auVar84._8_4_ = fStack_9e0 * fStack_a70 - fVar86 * fStack_8b0;
          auVar84._12_4_ = fStack_9dc * fStack_a6c - fVar87 * fStack_8ac;
          auVar30._4_4_ = -(uint)(ABS(fVar53 * fStack_a14) < ABS(fVar85 * fStack_8b4));
          auVar30._0_4_ = -(uint)(ABS(fVar52 * local_a18) < ABS(fVar83 * local_8b8));
          auVar30._8_4_ = -(uint)(ABS(fStack_9e0 * fStack_a10) < ABS(fVar86 * fStack_8b0));
          auVar30._12_4_ = -(uint)(ABS(fStack_9dc * fStack_a0c) < ABS(fVar87 * fStack_8ac));
          auVar12._4_4_ = fVar70 * fVar85 - fVar53 * fStack_a14;
          auVar12._0_4_ = fVar64 * fVar83 - fVar52 * local_a18;
          auVar12._8_4_ = fVar72 * fVar86 - fStack_9e0 * fStack_a10;
          auVar12._12_4_ = fVar73 * fVar87 - fStack_9dc * fStack_a0c;
          local_7e8 = blendvps(auVar84,auVar12,auVar30);
          fVar34 = fVar74 * local_808._0_4_ +
                   local_8a8 * local_7f8._0_4_ + fStack_aa0 * local_7e8._0_4_;
          fVar51 = fVar74 * local_808._4_4_ +
                   local_8a8 * local_7f8._4_4_ + fStack_aa0 * local_7e8._4_4_;
          fVar82 = fVar74 * local_808._8_4_ +
                   local_8a8 * local_7f8._8_4_ + fStack_aa0 * local_7e8._8_4_;
          fVar74 = fVar74 * local_808._12_4_ +
                   local_8a8 * local_7f8._12_4_ + fStack_aa0 * local_7e8._12_4_;
          auVar67._0_4_ = fVar34 + fVar34;
          auVar67._4_4_ = fVar51 + fVar51;
          auVar67._8_4_ = fVar82 + fVar82;
          auVar67._12_4_ = fVar74 + fVar74;
          auVar40._0_4_ = fVar93 * local_7e8._0_4_;
          auVar40._4_4_ = fVar95 * local_7e8._4_4_;
          auVar40._8_4_ = fStack_9f0 * local_7e8._8_4_;
          auVar40._12_4_ = fStack_9ec * local_7e8._12_4_;
          fVar23 = fVar97 * local_808._0_4_ + fVar88 * local_7f8._0_4_ + auVar40._0_4_;
          fVar24 = fVar99 * local_808._4_4_ + fVar89 * local_7f8._4_4_ + auVar40._4_4_;
          fVar75 = fStack_a30 * local_808._8_4_ + fStack_a40 * local_7f8._8_4_ + auVar40._8_4_;
          fVar78 = fStack_a2c * local_808._12_4_ + fStack_a3c * local_7f8._12_4_ + auVar40._12_4_;
          auVar66 = rcpps(auVar40,auVar67);
          fVar34 = auVar66._0_4_;
          fVar51 = auVar66._4_4_;
          fVar82 = auVar66._8_4_;
          fVar74 = auVar66._12_4_;
          local_818._0_4_ =
               (((float)DAT_01f46a60 - auVar67._0_4_ * fVar34) * fVar34 + fVar34) *
               (fVar23 + fVar23);
          local_818._4_4_ =
               ((DAT_01f46a60._4_4_ - auVar67._4_4_ * fVar51) * fVar51 + fVar51) * (fVar24 + fVar24)
          ;
          local_818._8_4_ =
               ((DAT_01f46a60._8_4_ - auVar67._8_4_ * fVar82) * fVar82 + fVar82) * (fVar75 + fVar75)
          ;
          local_818._12_4_ =
               ((DAT_01f46a60._12_4_ - auVar67._12_4_ * fVar74) * fVar74 + fVar74) *
               (fVar78 + fVar78);
          fVar34 = ray->tfar;
          fVar51 = (ray->org).field_0.m128[3];
          auVar68._0_4_ =
               (int)((uint)(auVar67._0_4_ != 0.0 &&
                           (local_818._0_4_ <= fVar34 && fVar51 <= local_818._0_4_)) * -0x80000000)
               >> 0x1f;
          auVar68._4_4_ =
               (int)((uint)(auVar67._4_4_ != 0.0 &&
                           (local_818._4_4_ <= fVar34 && fVar51 <= local_818._4_4_)) * -0x80000000)
               >> 0x1f;
          auVar68._8_4_ =
               (int)((uint)(auVar67._8_4_ != 0.0 &&
                           (local_818._8_4_ <= fVar34 && fVar51 <= local_818._8_4_)) * -0x80000000)
               >> 0x1f;
          auVar68._12_4_ =
               (int)((uint)(auVar67._12_4_ != 0.0 &&
                           (local_818._12_4_ <= fVar34 && fVar51 <= local_818._12_4_)) * -0x80000000
                    ) >> 0x1f;
          uVar13 = movmskps(iVar14,auVar68 & auVar47);
          local_a78 = uVar20;
          if (uVar13 != 0) {
            local_aa8 = local_aa8 + uVar16;
            fStack_880 = local_a68._8_4_;
            fStack_87c = local_a68._12_4_;
            local_878._4_4_ = fStack_a84;
            local_878._0_4_ = local_a88;
            local_878._8_4_ = fStack_a80;
            local_878._12_4_ = fStack_a7c;
            local_868._4_4_ = fStack_a24;
            local_868._0_4_ = local_a28;
            local_868._8_4_ = fStack_a20;
            local_868._12_4_ = fStack_a1c;
            local_858 = &local_aa9;
            local_848 = auVar68 & auVar47;
            auVar66 = rcpps(local_818,local_868);
            fVar34 = auVar66._0_4_;
            fVar51 = auVar66._4_4_;
            fVar82 = auVar66._8_4_;
            fVar74 = auVar66._12_4_;
            fVar34 = (float)(-(uint)(1e-18 <= ABS(local_a28)) &
                            (uint)(((float)DAT_01f46a60 - local_a28 * fVar34) * fVar34 + fVar34));
            fVar51 = (float)(-(uint)(1e-18 <= ABS(fStack_a24)) &
                            (uint)((DAT_01f46a60._4_4_ - fStack_a24 * fVar51) * fVar51 + fVar51));
            fVar82 = (float)(-(uint)(1e-18 <= ABS(fStack_a20)) &
                            (uint)((DAT_01f46a60._8_4_ - fStack_a20 * fVar82) * fVar82 + fVar82));
            fVar74 = (float)(-(uint)(1e-18 <= ABS(fStack_a1c)) &
                            (uint)((DAT_01f46a60._12_4_ - fStack_a1c * fVar74) * fVar74 + fVar74));
            auVar48._0_4_ = local_888 * fVar34;
            auVar48._4_4_ = fStack_884 * fVar51;
            auVar48._8_4_ = local_a68._8_4_ * fVar82;
            auVar48._12_4_ = local_a68._12_4_ * fVar74;
            local_838 = minps(auVar48,_DAT_01f46a60);
            auVar77._0_4_ = fVar34 * local_a88;
            auVar77._4_4_ = fVar51 * fStack_a84;
            auVar77._8_4_ = fVar82 * fStack_a80;
            auVar77._12_4_ = fVar74 * fStack_a7c;
            local_828 = minps(auVar77,_DAT_01f46a60);
            uVar15 = (ulong)(uVar13 & 0xff);
            local_9e8 = local_a50->scene;
            fStack_a9c = fStack_aa0;
            do {
              uVar20 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              local_9b0 = *(uint *)(local_aa8 + 0x90 + uVar20 * 4);
              pGVar6 = (local_9e8->geometries).items[local_9b0].ptr;
              if ((pGVar6->mask & local_a48->mask) == 0) {
                uVar15 = uVar15 ^ 1L << (uVar20 & 0x3f);
              }
              else {
                local_a88 = (float)uVar20;
                fStack_a84 = (float)(uVar20 >> 0x20);
                local_a68._0_8_ = uVar15;
                if ((local_a50->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006830dd:
                  local_a48->tfar = -INFINITY;
                  return;
                }
                local_a38 = local_a50->args;
                local_998.context = local_a50->user;
                local_9c8 = *(undefined4 *)(local_808 + uVar20 * 4);
                local_9c4 = *(undefined4 *)(local_7f8 + uVar20 * 4);
                local_9c0 = *(undefined4 *)(local_7e8 + uVar20 * 4);
                local_9bc = *(undefined4 *)(local_838 + uVar20 * 4);
                local_9b8 = *(undefined4 *)(local_828 + uVar20 * 4);
                local_9b4 = *(undefined4 *)(local_aa8 + 0xa0 + uVar20 * 4);
                local_9ac = (local_998.context)->instID[0];
                local_9a8 = (local_998.context)->instPrimID[0];
                local_a18 = local_a48->tfar;
                local_a48->tfar = *(float *)(local_818 + uVar20 * 4);
                local_a8c = -1;
                local_998.valid = &local_a8c;
                local_998.geometryUserPtr = pGVar6->userPtr;
                local_998.hit = (RTCHitN *)&local_9c8;
                local_998.N = 1;
                local_a28 = SUB84(pGVar6,0);
                fStack_a24 = (float)((ulong)pGVar6 >> 0x20);
                local_998.ray = (RTCRayN *)local_a48;
                if (((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar6->occlusionFilterN)(&local_998), *local_998.valid != 0)) &&
                   ((local_a38->filter == (RTCFilterFunctionN)0x0 ||
                    ((((local_a38->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(CONCAT44(fStack_a24,local_a28) + 0x3e) & 0x40) == 0)) ||
                     ((*local_a38->filter)(&local_998), *local_998.valid != 0))))))
                goto LAB_006830dd;
                local_a48->tfar = local_a18;
                uVar15 = local_a68._0_8_ ^ 1L << ((ulong)(uint)local_a88 & 0x3f);
              }
            } while (uVar15 != 0);
          }
        }
        ray = local_a48;
        puVar18 = local_a08;
        puVar19 = local_9f8;
        uVar20 = local_a78;
        fVar34 = local_8c8;
        fVar51 = fStack_8c4;
        fVar24 = fStack_8c0;
        fVar31 = fStack_8bc;
        fVar23 = local_8d8;
        fVar32 = fStack_8d4;
        fVar33 = fStack_8d0;
        fVar44 = fStack_8cc;
        auVar65 = local_8e8;
        fVar75 = local_938;
        fVar49 = fStack_934;
        fVar50 = fStack_930;
        fVar52 = fStack_92c;
        fVar78 = local_948;
        fVar53 = fStack_944;
        fVar54 = fStack_940;
        fVar55 = fStack_93c;
        fVar69 = local_968;
        fVar56 = fStack_964;
        fVar57 = fStack_960;
        fVar58 = fStack_95c;
        fVar82 = local_918;
        fVar60 = fStack_914;
        fVar61 = fStack_910;
        fVar62 = fStack_90c;
        fVar71 = local_8f8;
        fVar64 = fStack_8f4;
        fVar70 = fStack_8f0;
        fVar72 = fStack_8ec;
        fVar80 = local_908;
        fVar73 = fStack_904;
        fVar76 = fStack_900;
        fVar79 = fStack_8fc;
        fVar74 = local_928;
        fVar81 = fStack_924;
        fVar83 = fStack_920;
        fVar85 = fStack_91c;
        fVar63 = local_958;
        fVar86 = fStack_954;
        fVar87 = fStack_950;
        fVar88 = fStack_94c;
      }
      goto LAB_00682837;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }